

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install_info.cpp
# Opt level: O2

ExtensionRepository *
duckdb::ExtensionRepository::GetRepositoryByUrl
          (ExtensionRepository *__return_storage_ptr__,string *url)

{
  string repo_name;
  string sStack_38;
  
  if (url->_M_string_length == 0) {
    GetCoreRepository();
  }
  else {
    TryConvertUrlToKnownRepository(&sStack_38,url);
    ExtensionRepository(__return_storage_ptr__,&sStack_38,url);
    ::std::__cxx11::string::~string((string *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtensionRepository ExtensionRepository::GetRepositoryByUrl(const string &url) {
	if (url.empty()) {
		return GetCoreRepository();
	}

	auto repo_name = TryConvertUrlToKnownRepository(url);
	return {repo_name, url};
}